

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O3

void __thiscall rengine::SDLBackend::SDLBackend(SDLBackend *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined8 uVar8;
  char *local_58;
  long local_50;
  char local_48 [16];
  char local_38 [8];
  char buffer [16];
  
  (this->super_Backend)._vptr_Backend = (_func_int **)&PTR__Backend_0012d8d8;
  (this->super_Backend).m_running = true;
  if (Backend::m_singleton != (Backend *)0x0) {
    __assert_fail("!m_singleton",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/backend.h"
                  ,0x20,"rengine::Backend::Backend()");
  }
  Backend::m_singleton = &this->super_Backend;
  (this->super_Backend)._vptr_Backend = (_func_int **)&PTR__SDLBackend_0012d6a0;
  (this->super_SurfaceBackendImpl)._vptr_SurfaceBackendImpl = (_func_int **)&DAT_0012d720;
  this->m_surface = (Surface *)0x0;
  this->m_window = (SDL_Window *)0x0;
  *(undefined8 *)((long)&this->m_window + 1) = 0;
  *(undefined8 *)((long)&this->m_gl + 1) = 0;
  iVar4 = SDL_Init(0x20);
  if (-1 < iVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar5 = std::chrono::_V2::system_clock::now();
    auVar1 = SEXT816(lVar5 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar2 = SEXT816(lVar5 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar3 = SEXT816(lVar5 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_38,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar5 / 1000000000) +
                          ((int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar5 / 1000000) +
                          ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar5 / 1000) +
                          ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
    local_58 = local_48;
    sVar6 = strlen(local_38);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_38,local_38 + sVar6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"SDLBackend: created...",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    return;
  }
  uVar8 = SDL_GetError();
  printf("%s: %s\n","Unable to initialize SDL",uVar8);
  SDL_Quit();
  exit(1);
}

Assistant:

SDLBackend()
    {
        if (SDL_Init(SDL_INIT_VIDEO) < 0)
            SDLBackend_die("Unable to initialize SDL");
        logi << "SDLBackend: created..." << std::endl;
    }